

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int exprNodeIsConstantOrGroupBy(Walker *pWalker,Expr *pExpr)

{
  ExprList *pEVar1;
  Expr *pB;
  uint uVar2;
  int iVar3;
  CollSeq *pCVar4;
  long lVar5;
  ExprList_item *pEVar6;
  
  pEVar1 = (pWalker->u).pGroupBy;
  if (0 < pEVar1->nExpr) {
    pEVar6 = pEVar1->a;
    lVar5 = 0;
    do {
      pB = pEVar6->pExpr;
      uVar2 = sqlite3ExprCompare((Parse *)0x0,pExpr,pB,-1);
      if (uVar2 < 2) {
        pCVar4 = sqlite3ExprCollSeq(pWalker->pParse,pB);
        if (pCVar4 == (CollSeq *)0x0) {
          return 1;
        }
        if ((pCVar4->zName != (char *)0x0) &&
           (iVar3 = sqlite3StrICmp("BINARY",pCVar4->zName), iVar3 == 0)) {
          return 1;
        }
      }
      lVar5 = lVar5 + 1;
      pEVar6 = pEVar6 + 1;
    } while (lVar5 < pEVar1->nExpr);
  }
  if ((pExpr->flags & 0x800) != 0) {
    pWalker->eCode = '\0';
    return 2;
  }
  iVar3 = exprNodeIsConstant(pWalker,pExpr);
  return iVar3;
}

Assistant:

static int exprNodeIsConstantOrGroupBy(Walker *pWalker, Expr *pExpr){
  ExprList *pGroupBy = pWalker->u.pGroupBy;
  int i;

  /* Check if pExpr is identical to any GROUP BY term. If so, consider
  ** it constant.  */
  for(i=0; i<pGroupBy->nExpr; i++){
    Expr *p = pGroupBy->a[i].pExpr;
    if( sqlite3ExprCompare(0, pExpr, p, -1)<2 ){
      CollSeq *pColl = sqlite3ExprCollSeq(pWalker->pParse, p);
      if( pColl==0 || sqlite3_stricmp("BINARY", pColl->zName)==0 ){
        return WRC_Prune;
      }
    }
  }

  /* Check if pExpr is a sub-select. If so, consider it variable. */
  if( ExprHasProperty(pExpr, EP_xIsSelect) ){
    pWalker->eCode = 0;
    return WRC_Abort;
  }

  return exprNodeIsConstant(pWalker, pExpr);
}